

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DotOut.h
# Opt level: O3

ostream * Hpipe::dot_out<Hpipe::CharItem>(ostream *os,CharItem *val,int lim)

{
  ostream *poVar1;
  ostringstream ss;
  long *local_1b8;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  CharItem::write_to_stream(val,(ostream *)local_198);
  std::__cxx11::stringbuf::str();
  poVar1 = dot_out(os,(char *)local_1b8,lim);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return poVar1;
}

Assistant:

std::ostream &dot_out( std::ostream &os, const T &val, int lim = -1 ) {
    std::ostringstream ss;
    ss << val;
    return dot_out( os, ss.str().c_str(), lim );
}